

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.cpp
# Opt level: O3

MemoryStats * Jinx::GetMemoryStats(void)

{
  MemoryStats *in_RDI;
  
  in_RDI->allocationCount = 0;
  in_RDI->freeCount = 0;
  in_RDI->allocatedMemory = 0;
  in_RDI->allocationCount = (uint64_t)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i;
  in_RDI->freeCount = (uint64_t)Mem::freeCount.super___atomic_base<unsigned_long>._M_i;
  in_RDI->allocatedMemory = (uint64_t)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i;
  return in_RDI;
}

Assistant:

inline_t MemoryStats GetMemoryStats()
	{
		MemoryStats stats;
		stats.allocationCount = Mem::allocationCount;
		stats.freeCount = Mem::freeCount;
		stats.allocatedMemory = Mem::allocatedMemory;
		return stats;
	}